

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O1

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::Insert
          (CASC_FILE_TREE *this,PCONTENT_KEY pCKey,char *szFullPath,DWORD DataId,DWORD FileSize,
          DWORD LocaleId)

{
  bool bVar1;
  byte *pbVar2;
  ULONGLONG UVar3;
  PCASC_FILE_NODE pItem;
  size_t sVar4;
  size_t nLength;
  char chOneChar;
  byte bVar5;
  byte *szNodeEnd;
  DWORD Parent;
  char szNormPath [1025];
  byte *local_460;
  uchar local_438 [1032];
  
  bVar5 = *szFullPath;
  if (bVar5 == 0) {
    pItem = (PCASC_FILE_NODE)0x0;
    Parent = 0;
    nLength = 0;
    szNodeEnd = (byte *)szFullPath;
  }
  else {
    nLength = 0;
    sVar4 = 0;
    pItem = (PCASC_FILE_NODE)0x0;
    pbVar2 = (byte *)(szFullPath + 1);
    local_460 = (byte *)szFullPath;
    do {
      szNodeEnd = pbVar2;
      if ((bVar5 - 0x2f < 0x2e) && ((0x200000000801U >> ((ulong)(bVar5 - 0x2f) & 0x3f) & 1) != 0)) {
        UVar3 = CalcNormNameHash((char *)local_438,nLength);
        pItem = GetOrInsert(this,UVar3,(char *)local_460,(char *)(szNodeEnd + -1),(PCONTENT_KEY)0x0,
                            (DWORD)sVar4,0xffffffff);
        if (pItem != (PCASC_FILE_NODE)0x0) {
          pItem->Flags = (ushort)(bVar5 == 0x3a) * 2 | pItem->Flags | 1;
          sVar4 = CASC_ARRAY::IndexOf(&this->FileTable,pItem);
          local_460 = szNodeEnd;
          goto LAB_0010f35d;
        }
        bVar1 = false;
        pItem = (PCASC_FILE_NODE)0x0;
      }
      else {
LAB_0010f35d:
        local_438[nLength] = AsciiToUpperTable_BkSlash[(char)bVar5];
        bVar1 = true;
      }
      Parent = (DWORD)sVar4;
      if (!bVar1) goto LAB_0010f40a;
      nLength = nLength + 1;
      bVar5 = *szNodeEnd;
      szFullPath = (char *)local_460;
      pbVar2 = szNodeEnd + 1;
    } while (bVar5 != 0);
  }
  if (szFullPath < szNodeEnd) {
    UVar3 = CalcNormNameHash((char *)local_438,nLength);
    pItem = GetOrInsert(this,UVar3,szFullPath,(char *)szNodeEnd,pCKey,Parent,DataId);
    if (pItem == (PCASC_FILE_NODE)0x0) {
LAB_0010f40a:
      pItem = (PCASC_FILE_NODE)0x0;
    }
    else {
      if (this->FileSizeOffset != 0) {
        *(DWORD *)((pItem->CKey).Value + this->FileSizeOffset) = FileSize;
      }
      if (this->LocaleIdOffset != 0) {
        *(DWORD *)((pItem->CKey).Value + this->LocaleIdOffset) = LocaleId;
      }
    }
  }
  return pItem;
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::Insert(PCONTENT_KEY pCKey, const char * szFullPath, DWORD DataId, DWORD FileSize, DWORD LocaleId)
{
    PCASC_FILE_NODE pFileNode = NULL;
    const char * szNodeBegin = szFullPath;
    char szNormPath[MAX_PATH+1];
    DWORD Parent = 0;
    size_t i;

    // Traverse the entire path and make sure that all subdirs are there
    for(i = 0; szFullPath[i] != 0; i++)
    {
        char chOneChar = szFullPath[i];

        // Is there a path separator?
        // Note: Warcraft III paths may contain "mount points".
        // Example: "frFR-War3Local.mpq:Maps/FrozenThrone/Campaign/NightElfX06Interlude.w3x:war3map.j"
        if(chOneChar == '\\' || chOneChar == '/' || chOneChar == ':')
        {
            pFileNode = GetOrInsert(szNormPath, i, szNodeBegin, szFullPath + i, NULL, Parent, CASC_INVALID_ID);
            if(pFileNode == NULL)
                return NULL;

            // Supply the missing values
            pFileNode->Flags |= (chOneChar == ':') ? CFN_FLAG_MOUNT_POINT : 0;
            pFileNode->Flags |= CFN_FLAG_FOLDER;

            // Get the new parent item
            Parent = (DWORD)FileTable.IndexOf(pFileNode);

            // Also reset the begin of the node
            szNodeBegin = szFullPath + i + 1;
        }

        // Copy the next character, even if it was slash/backslash before
        szNormPath[i] = AsciiToUpperTable_BkSlash[chOneChar];
    }

    // If there is anything left, we insert it as file name
    if((szFullPath + i) > szNodeBegin)
    {
        pFileNode = GetOrInsert(szNormPath, i, szNodeBegin, szFullPath + i, pCKey, Parent, DataId);
        if(pFileNode != NULL)
        {
            SetExtras(pFileNode, FileSize, LocaleId);
        }
    }

    // Return the file node
    return pFileNode;
}